

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * pack21_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in - base;
  *out = (in[1] - base) * 0x200000 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] - base >> 0xb;
  *puVar1 = (in[2] - base) * 0x400 | *puVar1;
  *puVar1 = (in[3] - base) * -0x80000000 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[3] - base >> 1;
  *puVar1 = (in[4] - base) * 0x100000 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[4] - base >> 0xc;
  *puVar1 = (in[5] - base) * 0x200 | *puVar1;
  *puVar1 = (in[6] - base) * 0x40000000 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[6] - base >> 2;
  *puVar1 = (in[7] - base) * 0x80000 | *puVar1;
  out[5] = in[7] - base >> 0xd;
  return out + 6;
}

Assistant:

uint32_t * pack21_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  21 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  10 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  10 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  31 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  20 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  9 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  9 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  30 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  19 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  19 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 21  -  8 );
    ++in;

    return out + 1;
}